

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O3

void CChat::ConSayTeam(IResult *pResult,void *pUserData)

{
  int iVar1;
  undefined4 extraout_var;
  int64 iVar2;
  long in_FS_OFFSET;
  CNetMsg_Cl_Say local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (*pResult->_vptr_IResult[4])(pResult,0);
  iVar2 = time_get();
  *(int64 *)((long)pUserData + 0x363b0) = iVar2;
  local_28.m_Mode = 2;
  local_28.m_Target = -1;
  local_28.m_pMessage = (char *)CONCAT44(extraout_var,iVar1);
  IClient::SendPackMsg<CNetMsg_Cl_Say>
            (*(IClient **)(*(long *)((long)pUserData + 8) + 0x858),&local_28,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CChat::ConSayTeam(IConsole::IResult *pResult, void *pUserData)
{
	((CChat*)pUserData)->Say(CHAT_TEAM, pResult->GetString(0));
}